

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::SingleFieldGenerator::GeneratePropertyDeclaration
          (SingleFieldGenerator *this,Printer *printer)

{
  pointer pSVar1;
  Printer *pPVar2;
  bool bVar3;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  vars;
  anon_class_1_0_00000001 local_129;
  Printer *local_128;
  long *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  undefined8 uStack_108;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_100;
  long *local_e8;
  undefined8 local_e0;
  long local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [24];
  code *local_b0;
  byte local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 local_80;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_78;
  
  pSVar1 = (this->super_FieldGenerator).variables_.subs_.
           super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           ._M_impl.super__Vector_impl_data._M_start;
  vars_00.len_ = ((long)(this->super_FieldGenerator).variables_.subs_.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
                 -0x2c8590b21642c859;
  vars_00.ptr_ = pSVar1;
  local_128 = printer;
  io::Printer::WithDefs(&local_100,printer,vars_00,false);
  pPVar2 = local_128;
  local_120 = (long *)&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"comments","");
  if (local_120 == (long *)&local_110) {
    uStack_d0 = uStack_108;
    local_e8 = &local_d8;
  }
  else {
    local_e8 = local_120;
  }
  local_d8 = CONCAT71(uStack_10f,local_110);
  local_e0 = local_118;
  local_118 = 0;
  local_110 = 0;
  local_120 = (long *)&local_110;
  local_c8._0_8_ = operator_new(0x18);
  *(Printer ***)local_c8._0_8_ = &local_128;
  *(SingleFieldGenerator **)(local_c8._0_8_ + 8) = this;
  *(undefined1 *)(local_c8._0_8_ + 0x10) = 0;
  local_b0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  local_c8._8_8_ = 0;
  local_c8._16_8_ =
       std::
       _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
       ::_M_manager;
  local_a8 = 1;
  local_98 = 0;
  local_90 = 0;
  local_80 = 0;
  local_a0 = &local_90;
  std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x53a374);
  local_78._M_engaged = false;
  io::Printer::Emit(pPVar2,&local_e8,1,0x8e,
                    "\n                  $comments$\n                  @property(nonatomic, readwrite) $property_type$$name$$ deprecated_attribute$;\n                "
                   );
  if (local_78._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_78);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_a8]._M_data)
            (&local_129,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)local_c8);
  local_a8 = 0xff;
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if (local_120 != (long *)&local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  bVar3 = FieldGenerator::WantsHasProperty(&this->super_FieldGenerator);
  if (bVar3) {
    io::Printer::Emit(local_128,0,0,0x56,
                      "\n      @property(nonatomic, readwrite) BOOL $hazzer_name$$ deprecated_attribute$;\n    "
                     );
  }
  io::Printer::Emit(local_128,0,0,1,"\n");
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_100);
  return;
}

Assistant:

void SingleFieldGenerator::GeneratePropertyDeclaration(
    io::Printer* printer) const {
  auto vars = variables_.Install(printer);
  printer->Emit({{"comments",
                  [&] {
                    EmitCommentsString(printer, generation_options_,
                                       descriptor_);
                  }}},
                R"objc(
                  $comments$
                  @property(nonatomic, readwrite) $property_type$$name$$ deprecated_attribute$;
                )objc");
  if (WantsHasProperty()) {
    printer->Emit(R"objc(
      @property(nonatomic, readwrite) BOOL $hazzer_name$$ deprecated_attribute$;
    )objc");
  }
  printer->Emit("\n");
}